

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O2

void __thiscall
btAlignedObjectArray<btMultibodyLink>::resize
          (btAlignedObjectArray<btMultibodyLink> *this,int newsize,btMultibodyLink *fillData)

{
  undefined8 *puVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  
  iVar2 = this->m_size;
  lVar5 = (long)iVar2;
  if (iVar2 <= newsize) {
    if (iVar2 < newsize) {
      reserve(this,newsize);
    }
    lVar6 = lVar5 * 600 + 0x248;
    for (; lVar5 < newsize; lVar5 = lVar5 + 1) {
      puVar1 = (undefined8 *)((long)(this->m_data->m_inertiaLocal).m_floats + lVar6 + -4);
      memcpy(puVar1 + -0x49,fillData,0x208);
      uVar3 = *(undefined8 *)((fillData->m_cachedWorldTransform).m_basis.m_el[0].m_floats + 2);
      puVar1[-8] = *(undefined8 *)(fillData->m_cachedWorldTransform).m_basis.m_el[0].m_floats;
      puVar1[-7] = uVar3;
      uVar3 = *(undefined8 *)((fillData->m_cachedWorldTransform).m_basis.m_el[1].m_floats + 2);
      puVar1[-6] = *(undefined8 *)(fillData->m_cachedWorldTransform).m_basis.m_el[1].m_floats;
      puVar1[-5] = uVar3;
      uVar3 = *(undefined8 *)((fillData->m_cachedWorldTransform).m_basis.m_el[2].m_floats + 2);
      puVar1[-4] = *(undefined8 *)(fillData->m_cachedWorldTransform).m_basis.m_el[2].m_floats;
      puVar1[-3] = uVar3;
      uVar3 = *(undefined8 *)((fillData->m_cachedWorldTransform).m_origin.m_floats + 2);
      puVar1[-2] = *(undefined8 *)(fillData->m_cachedWorldTransform).m_origin.m_floats;
      puVar1[-1] = uVar3;
      pcVar4 = fillData->m_jointName;
      *puVar1 = fillData->m_linkName;
      puVar1[1] = pcVar4;
      lVar6 = lVar6 + 600;
    }
  }
  this->m_size = newsize;
  return;
}

Assistant:

SIMD_FORCE_INLINE	void	resize(int newsize, const T& fillData=T())
		{
			const BT_REGISTER int curSize = size();

			if (newsize < curSize)
			{
				for(int i = newsize; i < curSize; i++)
				{
					m_data[i].~T();
				}
			} else
			{
				if (newsize > curSize)
				{
					reserve(newsize);
				}
#ifdef BT_USE_PLACEMENT_NEW
				for (int i=curSize;i<newsize;i++)
				{
					new ( &m_data[i]) T(fillData);
				}
#endif //BT_USE_PLACEMENT_NEW

			}

			m_size = newsize;
		}